

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

ACT_NODE_t * node_create_next(ACT_NODE_t *nod,AC_ALPHABET_t alpha)

{
  ACT_NODE_t *pAVar1;
  AC_ALPHABET_t in_SIL;
  ACT_NODE_t *in_RDI;
  ACT_NODE_t *next;
  ac_trie *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  pAVar1 = node_find_next(in_RDI,in_SIL);
  if (pAVar1 == (ACT_NODE_t *)0x0) {
    local_8 = node_create(in_stack_ffffffffffffffe0);
    node_add_edge(in_RDI,(ACT_NODE_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                  (AC_ALPHABET_t)((ulong)local_8 >> 0x38));
  }
  else {
    local_8 = (ACT_NODE_t *)0x0;
  }
  return local_8;
}

Assistant:

ACT_NODE_t *node_create_next (ACT_NODE_t *nod, AC_ALPHABET_t alpha)
{
    ACT_NODE_t *next;
    
    if (node_find_next (nod, alpha) != NULL)
        /* The edge already exists */
        return NULL;
    
    next = node_create (nod->trie);
    node_add_edge (nod, next, alpha);
    
    return next;
}